

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qatomic_cxx11.h
# Opt level: O0

int QAtomicOps<int>::loadRelaxed<int>(atomic<int> *_q_value)

{
  memory_order mVar1;
  int *in_RDI;
  memory_order __b;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int __line;
  int *__file;
  
  __file = in_RDI;
  mVar1 = std::operator&(memory_order_relaxed,__memory_order_mask);
  __line = (int)((ulong)in_RDI >> 0x20);
  if (mVar1 == memory_order_release) {
    std::__replacement_assert
              ((char *)__file,__line,
               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  if (mVar1 != memory_order_acq_rel) {
    return *in_RDI;
  }
  std::__replacement_assert
            ((char *)__file,__line,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
}

Assistant:

static inline
    T loadRelaxed(const std::atomic<T> &_q_value) noexcept
    {
        return _q_value.load(std::memory_order_relaxed);
    }